

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dchChoice.c
# Opt level: O3

Aig_Man_t * Dch_DeriveChoiceAig(Aig_Man_t *pAig,int fSkipRedSupps)

{
  Aig_Man_t *p;
  Aig_Man_t *pAVar1;
  
  p = Dch_DeriveChoiceAigInt(pAig,fSkipRedSupps);
  if (p->pReprs != (Aig_Obj_t **)0x0) {
    free(p->pReprs);
    p->pReprs = (Aig_Obj_t **)0x0;
  }
  pAVar1 = Aig_ManDupDfs(p);
  Aig_ManStop(p);
  return pAVar1;
}

Assistant:

Aig_Man_t * Dch_DeriveChoiceAig( Aig_Man_t * pAig, int fSkipRedSupps )
{
    int fCheck = 0;
    Aig_Man_t * pChoices, * pTemp;
    // verify
    if ( fCheck )
        Aig_ManCheckReprs( pAig ); 
    // compute choices
    pChoices = Dch_DeriveChoiceAigInt( pAig, fSkipRedSupps );
    ABC_FREE( pChoices->pReprs );
    // verify
    if ( fCheck )
        Dch_CheckChoices( pChoices, fSkipRedSupps ); 
    // find correct topo order with choices
    pChoices = Aig_ManDupDfs( pTemp = pChoices );
    Aig_ManStop( pTemp );
    // verify
    if ( fCheck )
        Dch_CheckChoices( pChoices, fSkipRedSupps ); 
    return pChoices;
}